

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O3

double __thiscall RandomGen::rand_skewGauss(RandomGen *this,double xi,double omega,double alpha)

{
  long lVar1;
  RandomGen *pRVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  unsigned_long uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar13 = alpha / SQRT(alpha * alpha + 1.0);
  dVar8 = dVar13 * 0.7978845608028654;
  dVar9 = pow(dVar8,3.0);
  dVar10 = pow(((dVar13 + dVar13) * dVar13) / -3.141592653589793 + 1.0,1.5);
  dVar13 = 1.0 - dVar8 * dVar8;
  if (dVar13 < 0.0) {
    dVar14 = sqrt(dVar13);
    dVar13 = dVar14;
  }
  else {
    dVar14 = SQRT(dVar13);
  }
  dVar9 = (dVar9 / dVar10) * 0.42920367320510344;
  if (0.0 < alpha) {
    dVar13 = exp(-6.283185307179586 / alpha);
    dVar13 = dVar13 * -0.5 + dVar9 * -0.5 * dVar14 + dVar8;
  }
  if (alpha < 0.0) {
    dVar13 = exp(6.283185307179586 / alpha);
    dVar13 = dVar13 * 0.5 + dVar9 * -0.5 * dVar14 + dVar8;
  }
  dVar13 = (dVar13 * omega + xi) - xi;
  dVar8 = dVar13 / omega;
  dVar8 = exp(dVar8 * dVar8 * -0.5);
  dVar13 = erfc(((dVar13 * alpha) / omega) / -1.414213562373095);
  dVar9 = omega * -6.0 + xi;
  bVar6 = false;
  do {
    if (m_pInstance == (RandomGen *)0x0) {
      m_pInstance = (RandomGen *)operator_new(0x18);
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
           0xc1f651c67c62c6e0;
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
           0x30d89576f866ac9f;
      m_pInstance->rng_locked = false;
      uVar3 = 0x30d89576f866ac9f;
      uVar7 = 0xc1f651c67c62c6e0;
    }
    else {
      uVar7 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
      uVar3 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
    }
    pRVar2 = m_pInstance;
    lVar1 = uVar3 + uVar7;
    uVar4 = uVar3 ^ uVar7;
    uVar5 = uVar4 << 0x10 ^ (uVar7 << 0x18 | uVar7 >> 0x28) ^ uVar4;
    uVar4 = uVar4 << 0x25 | uVar4 >> 0x1b;
    auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar11._0_8_ = lVar1;
    auVar11._12_4_ = 0x45300000;
    dVar15 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 5.421010862427522e-20
             * ((omega * 6.0 + xi) - dVar9) + dVar9;
    lVar1 = uVar4 + uVar5;
    uVar4 = uVar4 ^ uVar5;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         uVar4 << 0x10 ^ (uVar5 << 0x18 | uVar5 >> 0x28) ^ uVar4;
    (pRVar2->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         uVar4 << 0x25 | uVar4 >> 0x1b;
    auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar12._0_8_ = lVar1;
    auVar12._12_4_ = 0x45300000;
    dVar10 = dVar15 - xi;
    dVar14 = dVar10 / omega;
    dVar14 = exp(dVar14 * dVar14 * -0.5);
    dVar10 = erfc(((dVar10 * -alpha) / omega) / 1.414213562373095);
    if (((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 5.421010862427522e-20 *
        dVar13 * (dVar8 / (omega * 2.5066282746310007)) <=
        dVar10 * (dVar14 / (omega * 2.5066282746310007))) {
      bVar6 = true;
    }
  } while (!bVar6);
  return dVar15;
}

Assistant:

double RandomGen::rand_skewGauss(double xi, double omega, double alpha) {
  double delta = alpha / sqrt(1 + alpha * alpha);
  double gamma1 = four_minus_PI_div_2 *
                  (pow(delta * sqrt2_div_PI, 3.) /
                   pow(1 - 2. * delta * delta / M_PI, 1.5));  // skewness
  double muz = delta * sqrt2_div_PI;
  double sigz = sqrt(1. - muz * muz);
  double m_o;
  if (alpha > 0.) {
    m_o = muz - 0.5 * gamma1 * sigz - 0.5 * exp(-two_PI / alpha);
  }
  if (alpha < 0.) {
    m_o = muz - 0.5 * gamma1 * sigz + 0.5 * exp(two_PI / alpha);
  }
  double mode = xi + omega * m_o;
  // the height should be the value of the PDF at the mode
  double height = exp(-0.5 * (pow((mode - xi) / omega, 2.))) /
                  (sqrt2_PI * omega) *
                  erfc(-1. * alpha * (mode - xi) / omega / sqrt2);
  bool gotValue = false;
  double minX = xi - 6. * omega;
  double maxX =
      xi + 6. * omega;  // +/- 6sigma should be essentially +/- infinity
                        //  can increase these for even better accuracy, at the
                        //  cost of speed
  double testX, testY, testProb;
  while (gotValue == false) {
    testX = minX + (maxX - minX) * RandomGen::rndm()->rand_uniform();
    testY = height *
            RandomGen::rndm()->rand_uniform();  // between 0 and peak height
    // calculate the value of the skewGauss PDF at the test x-value
    testProb = exp(-0.5 * (pow((testX - xi) / omega, 2.))) /
               (sqrt2_PI * omega) *
               erfc(-1. * alpha * (testX - xi) / omega / sqrt2);
    if (testProb >= testY) {
      gotValue = true;
    }
  }
  return testX;
}